

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void cfd::core::ConfidentialValue::CheckVersion(uint8_t version)

{
  CfdException *this;
  allocator local_49;
  string local_48;
  CfdSourceLocation local_28;
  uint8_t local_9 [8];
  uint8_t version_local;
  
  if ((((version != '\0') && (version != '\x01')) && (version != '\b')) && (version != '\t')) {
    local_9[0] = version;
    local_28.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_28.filename = local_28.filename + 1;
    local_28.line = 0x252;
    local_28.funcname = "CheckVersion";
    logger::warn<unsigned_char&>(&local_28,"Value version Invalid. version={}.",local_9);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_48,"Value version Invalid.",&local_49);
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_48);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void ConfidentialValue::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 0x08) &&
      (version != 0x09)) {
    warn(CFD_LOG_SOURCE, "Value version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Value version Invalid.");
  }
}